

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec6ComposeLut4(int t,word *f)

{
  word wVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  wVar1 = 0;
  uVar2 = 0;
  do {
    if (((uint)t >> (uVar2 & 0x1f) & 1) != 0) {
      uVar3 = 0xffffffffffffffff;
      lVar4 = 0;
      do {
        uVar3 = uVar3 & ((ulong)((uVar2 >> ((uint)lVar4 & 0x1f) & 1) != 0) - 1 ^ f[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      wVar1 = wVar1 | uVar3;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10);
  return wVar1;
}

Assistant:

static word If_Dec6ComposeLut4( int t, word f[4] )
{
    int m, v;
    word c, r = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c = ~(word)0;
        for ( v = 0; v < 4; v++ )
            c &= ((m >> v) & 1) ? f[v] : ~f[v];
        r |= c;
    }
    return r;
}